

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarestimator.cxx
# Opt level: O3

Matrix * __thiscall
ScalarEstimator::getEstimate(Matrix *__return_storage_ptr__,ScalarEstimator *this,Property *p)

{
  StochasticProcess *pSVar1;
  pointer pcVar2;
  uint uVar3;
  ostream *this_00;
  long *plVar4;
  Physical *this_01;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  int i;
  long lVar10;
  double dVar11;
  ulong *local_5b8;
  long local_5b0;
  ulong local_5a8;
  undefined4 uStack_5a0;
  undefined4 uStack_59c;
  ulong *local_598;
  long local_590;
  ulong local_588 [2];
  long *local_578;
  long local_570;
  long local_568;
  long lStack_560;
  long *local_558 [2];
  long local_548 [2];
  double local_538;
  double local_530;
  Matrix local_528;
  undefined1 local_428 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_410 [14];
  Physical local_328;
  Physical local_290;
  Physical local_1f8;
  Physical local_160;
  Physical local_c8;
  
  uVar3 = (this->super_Estimator).nSamples;
  if (uVar3 == 0) {
    local_530 = 1.0;
  }
  else {
    local_530 = (double)uVar3;
  }
  uVar3 = (this->super_Estimator).nEstimate & *p;
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 4) == 0) {
      if ((uVar3 & 8) == 0) {
        if ((uVar3 & 2) == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"didn\'t find property",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
          std::ostream::put(-0x68);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"stored: ",8);
          this_00 = (ostream *)
                    std::ostream::operator<<(&std::cout,(this->super_Estimator).nEstimate);
          std::__ostream_insert<char,std::char_traits<char>>(this_00,", requested: ",0xd);
          plVar4 = (long *)std::ostream::operator<<(this_00,*p);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          std::ostream::flush();
          Matrix::Matrix(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        Matrix::Matrix(__return_storage_ptr__,this->nDist,2);
        this_01 = (Physical *)operator_new(0x98);
        Physical::Physical(this_01);
        Physical::Physical(&local_290,this_01);
        Matrix::setPhysical(__return_storage_ptr__,0,&local_290);
        Physical::~Physical(&local_290);
        pSVar1 = (this->super_Estimator).pSource;
        if (pSVar1 == (StochasticProcess *)0x0) goto LAB_00143932;
        Physical::Physical(&local_328,&pSVar1->super_Physical);
        Matrix::setPhysical(__return_storage_ptr__,&local_328);
        Physical::~Physical(&local_328);
        pSVar1 = (this->super_Estimator).pSource;
        pcVar2 = (pSVar1->super_Parametric).parametricName._M_dataplus._M_p;
        local_558[0] = local_548;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_558,pcVar2,
                   pcVar2 + (pSVar1->super_Parametric).parametricName._M_string_length);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_558,0,(char *)0x0,0x14d380);
        local_578 = &local_568;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_568 = *plVar6;
          lStack_560 = plVar4[3];
        }
        else {
          local_568 = *plVar6;
          local_578 = (long *)*plVar4;
        }
        local_570 = plVar4[1];
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
        puVar7 = (ulong *)(plVar4 + 2);
        if ((ulong *)*plVar4 == puVar7) {
          local_5a8 = *puVar7;
          uStack_5a0 = (undefined4)plVar4[3];
          uStack_59c = *(undefined4 *)((long)plVar4 + 0x1c);
          local_5b8 = &local_5a8;
        }
        else {
          local_5a8 = *puVar7;
          local_5b8 = (ulong *)*plVar4;
        }
        local_5b0 = plVar4[1];
        *plVar4 = (long)puVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        pSVar1 = (this->super_Estimator).pSource;
        pcVar2 = (pSVar1->super_Parametric).parametricType._M_dataplus._M_p;
        local_598 = local_588;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_598,pcVar2,
                   pcVar2 + (pSVar1->super_Parametric).parametricType._M_string_length);
        uVar9 = 0xf;
        if (local_5b8 != &local_5a8) {
          uVar9 = local_5a8;
        }
        if (uVar9 < (ulong)(local_590 + local_5b0)) {
          uVar9 = 0xf;
          if (local_598 != local_588) {
            uVar9 = local_588[0];
          }
          if (uVar9 < (ulong)(local_590 + local_5b0)) goto LAB_001437b3;
          puVar5 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_5b8);
        }
        else {
LAB_001437b3:
          puVar5 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_598);
        }
        local_528.super_Physical._vptr_Physical =
             (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length;
        psVar8 = puVar5 + 2;
        if ((size_type *)*puVar5 == psVar8) {
          local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
          local_528.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar5[3];
        }
        else {
          local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
          local_528.super_Physical._vptr_Physical = (_func_int **)*puVar5;
        }
        local_528.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar5[1];
        *puVar5 = psVar8;
        puVar5[1] = 0;
        *(undefined1 *)psVar8 = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_528);
        psVar8 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar8) {
          local_428._16_8_ = *psVar8;
          aaStack_410[0]._0_8_ = plVar4[3];
          local_428._0_8_ = local_428 + 0x10;
        }
        else {
          local_428._16_8_ = *psVar8;
          local_428._0_8_ = (size_type *)*plVar4;
        }
        local_428._8_8_ = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        Matrix::setName(__return_storage_ptr__,(string *)local_428);
        if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
          operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
        }
        if (local_528.super_Physical._vptr_Physical !=
            (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length) {
          operator_delete(local_528.super_Physical._vptr_Physical,
                          local_528.super_Physical.physicalDescription._M_string_length + 1);
        }
        if (local_598 != local_588) {
          operator_delete(local_598,local_588[0] + 1);
        }
        if (local_5b8 != &local_5a8) {
          operator_delete(local_5b8,local_5a8 + 1);
        }
        if (local_578 != &local_568) {
          operator_delete(local_578,local_568 + 1);
        }
        if (local_558[0] != local_548) {
          operator_delete(local_558[0],local_548[0] + 1);
        }
LAB_00143932:
        if (this->nDist < 1) {
          return __return_storage_ptr__;
        }
        lVar10 = 0;
        do {
          i = (int)lVar10;
          local_538 = (double)i * this->dDistScale + this->dDistOffset;
          Matrix::operator[](&local_528,__return_storage_ptr__,i);
          Matrix::operator[]((Matrix *)local_428,&local_528,0);
          Matrix::operator=((Matrix *)local_428,local_538);
          Matrix::~Matrix((Matrix *)local_428);
          Matrix::~Matrix(&local_528);
          local_538 = (this->aDist[lVar10] / local_530) / this->dDistScale;
          Matrix::operator[](&local_528,__return_storage_ptr__,i);
          Matrix::operator[]((Matrix *)local_428,&local_528,1);
          Matrix::operator=((Matrix *)local_428,local_538);
          Matrix::~Matrix((Matrix *)local_428);
          Matrix::~Matrix(&local_528);
          lVar10 = lVar10 + 1;
        } while (lVar10 < this->nDist);
        return __return_storage_ptr__;
      }
      Matrix::Matrix(__return_storage_ptr__);
      pSVar1 = (this->super_Estimator).pSource;
      dVar11 = this->dOne;
      if (pSVar1 == (StochasticProcess *)0x0) goto LAB_001436ab;
      local_538 = this->dOne;
      Physical::Physical(&local_1f8,&pSVar1->super_Physical);
      Matrix::setPhysical(__return_storage_ptr__,&local_1f8);
      Physical::~Physical(&local_1f8);
      pSVar1 = (this->super_Estimator).pSource;
      pcVar2 = (pSVar1->super_Parametric).parametricName._M_dataplus._M_p;
      local_558[0] = local_548;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_558,pcVar2,
                 pcVar2 + (pSVar1->super_Parametric).parametricName._M_string_length);
      plVar4 = (long *)std::__cxx11::string::replace((ulong)local_558,0,(char *)0x0,0x14c0ec);
      local_578 = &local_568;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        local_568 = *plVar6;
        lStack_560 = plVar4[3];
      }
      else {
        local_568 = *plVar6;
        local_578 = (long *)*plVar4;
      }
      local_570 = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_5a8 = *puVar7;
        uStack_5a0 = (undefined4)plVar4[3];
        uStack_59c = *(undefined4 *)((long)plVar4 + 0x1c);
        local_5b8 = &local_5a8;
      }
      else {
        local_5a8 = *puVar7;
        local_5b8 = (ulong *)*plVar4;
      }
      local_5b0 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      pSVar1 = (this->super_Estimator).pSource;
      pcVar2 = (pSVar1->super_Parametric).parametricType._M_dataplus._M_p;
      local_598 = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_598,pcVar2,
                 pcVar2 + (pSVar1->super_Parametric).parametricType._M_string_length);
      uVar9 = 0xf;
      if (local_5b8 != &local_5a8) {
        uVar9 = local_5a8;
      }
      if (uVar9 < (ulong)(local_590 + local_5b0)) {
        uVar9 = 0xf;
        if (local_598 != local_588) {
          uVar9 = local_588[0];
        }
        if (uVar9 < (ulong)(local_590 + local_5b0)) goto LAB_00143523;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_5b8);
      }
      else {
LAB_00143523:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_598);
      }
      local_528.super_Physical._vptr_Physical =
           (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length;
      psVar8 = puVar5 + 2;
      if ((size_type *)*puVar5 == psVar8) {
        local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
        local_528.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar5[3];
      }
      else {
        local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
        local_528.super_Physical._vptr_Physical = (_func_int **)*puVar5;
      }
      local_528.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar5[1];
      *puVar5 = psVar8;
      puVar5[1] = 0;
      *(undefined1 *)psVar8 = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_528);
      psVar8 = (size_type *)(plVar4 + 2);
      if ((size_type *)*plVar4 == psVar8) {
        local_428._16_8_ = *psVar8;
        aaStack_410[0]._0_8_ = plVar4[3];
        local_428._0_8_ = local_428 + 0x10;
      }
      else {
        local_428._16_8_ = *psVar8;
        local_428._0_8_ = (size_type *)*plVar4;
      }
      local_428._8_8_ = plVar4[1];
      *plVar4 = (long)psVar8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      Matrix::setName(__return_storage_ptr__,(string *)local_428);
      if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
        operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
      }
      if (local_528.super_Physical._vptr_Physical !=
          (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length) {
        operator_delete(local_528.super_Physical._vptr_Physical,
                        local_528.super_Physical.physicalDescription._M_string_length + 1);
      }
      if (local_598 != local_588) {
        operator_delete(local_598,local_588[0] + 1);
      }
      if (local_5b8 != &local_5a8) {
        operator_delete(local_5b8,local_5a8 + 1);
      }
      if (local_578 != &local_568) {
        operator_delete(local_578,local_568 + 1);
      }
      dVar11 = local_538;
      if (local_558[0] != local_548) {
        operator_delete(local_558[0],local_548[0] + 1);
        dVar11 = local_538;
      }
LAB_001436ab:
      Matrix::operator=(__return_storage_ptr__,
                        this->dTwo / local_530 - (dVar11 / local_530) * (dVar11 / local_530));
      return __return_storage_ptr__;
    }
    Matrix::Matrix(__return_storage_ptr__);
    pSVar1 = (this->super_Estimator).pSource;
    if (pSVar1 == (StochasticProcess *)0x0) goto LAB_0014342b;
    Physical::Physical(&local_160,&pSVar1->super_Physical);
    Matrix::setPhysical(__return_storage_ptr__,&local_160);
    Physical::~Physical(&local_160);
    pSVar1 = (this->super_Estimator).pSource;
    pcVar2 = (pSVar1->super_Parametric).parametricName._M_dataplus._M_p;
    local_558[0] = local_548;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_558,pcVar2,
               pcVar2 + (pSVar1->super_Parametric).parametricName._M_string_length);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_558,0,(char *)0x0,0x14c084);
    local_578 = &local_568;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_568 = *plVar6;
      lStack_560 = plVar4[3];
    }
    else {
      local_568 = *plVar6;
      local_578 = (long *)*plVar4;
    }
    local_570 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
    puVar7 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar7) {
      local_5a8 = *puVar7;
      uStack_5a0 = (undefined4)plVar4[3];
      uStack_59c = *(undefined4 *)((long)plVar4 + 0x1c);
      local_5b8 = &local_5a8;
    }
    else {
      local_5a8 = *puVar7;
      local_5b8 = (ulong *)*plVar4;
    }
    local_5b0 = plVar4[1];
    *plVar4 = (long)puVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    pSVar1 = (this->super_Estimator).pSource;
    pcVar2 = (pSVar1->super_Parametric).parametricType._M_dataplus._M_p;
    local_598 = local_588;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_598,pcVar2,
               pcVar2 + (pSVar1->super_Parametric).parametricType._M_string_length);
    uVar9 = 0xf;
    if (local_5b8 != &local_5a8) {
      uVar9 = local_5a8;
    }
    if (uVar9 < (ulong)(local_590 + local_5b0)) {
      uVar9 = 0xf;
      if (local_598 != local_588) {
        uVar9 = local_588[0];
      }
      if (uVar9 < (ulong)(local_590 + local_5b0)) goto LAB_001432ac;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_5b8);
    }
    else {
LAB_001432ac:
      puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_598);
    }
    local_528.super_Physical._vptr_Physical =
         (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length;
    psVar8 = puVar5 + 2;
    if ((size_type *)*puVar5 == psVar8) {
      local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
      local_528.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar5[3];
    }
    else {
      local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
      local_528.super_Physical._vptr_Physical = (_func_int **)*puVar5;
    }
    local_528.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar5[1];
    *puVar5 = psVar8;
    puVar5[1] = 0;
    *(undefined1 *)psVar8 = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_528);
    psVar8 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar8) {
      local_428._16_8_ = *psVar8;
      aaStack_410[0]._0_8_ = plVar4[3];
      local_428._0_8_ = local_428 + 0x10;
    }
    else {
      local_428._16_8_ = *psVar8;
      local_428._0_8_ = (size_type *)*plVar4;
    }
    local_428._8_8_ = plVar4[1];
    *plVar4 = (long)psVar8;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Matrix::setName(__return_storage_ptr__,(string *)local_428);
    if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
      operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
    }
    if (local_528.super_Physical._vptr_Physical !=
        (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length) {
      operator_delete(local_528.super_Physical._vptr_Physical,
                      local_528.super_Physical.physicalDescription._M_string_length + 1);
    }
    if (local_598 != local_588) {
      operator_delete(local_598,local_588[0] + 1);
    }
    if (local_5b8 != &local_5a8) {
      operator_delete(local_5b8,local_5a8 + 1);
    }
    if (local_578 != &local_568) {
      operator_delete(local_578,local_568 + 1);
    }
    if (local_558[0] != local_548) {
      operator_delete(local_558[0],local_548[0] + 1);
    }
LAB_0014342b:
    Matrix::operator=(__return_storage_ptr__,this->dOne / local_530);
    return __return_storage_ptr__;
  }
  Matrix::Matrix(__return_storage_ptr__);
  pSVar1 = (this->super_Estimator).pSource;
  if (pSVar1 == (StochasticProcess *)0x0) goto LAB_001430be;
  Physical::Physical(&local_c8,&pSVar1->super_Physical);
  Matrix::setPhysical(__return_storage_ptr__,&local_c8);
  Physical::~Physical(&local_c8);
  pSVar1 = (this->super_Estimator).pSource;
  pcVar2 = (pSVar1->super_Parametric).parametricName._M_dataplus._M_p;
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_558,pcVar2,
             pcVar2 + (pSVar1->super_Parametric).parametricName._M_string_length);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_558,0,(char *)0x0,0x14c05a);
  local_578 = &local_568;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_568 = *plVar6;
    lStack_560 = plVar4[3];
  }
  else {
    local_568 = *plVar6;
    local_578 = (long *)*plVar4;
  }
  local_570 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_578);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_5a8 = *puVar7;
    uStack_5a0 = (undefined4)plVar4[3];
    uStack_59c = *(undefined4 *)((long)plVar4 + 0x1c);
    local_5b8 = &local_5a8;
  }
  else {
    local_5a8 = *puVar7;
    local_5b8 = (ulong *)*plVar4;
  }
  local_5b0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  pSVar1 = (this->super_Estimator).pSource;
  pcVar2 = (pSVar1->super_Parametric).parametricType._M_dataplus._M_p;
  local_598 = local_588;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_598,pcVar2,
             pcVar2 + (pSVar1->super_Parametric).parametricType._M_string_length);
  uVar9 = 0xf;
  if (local_5b8 != &local_5a8) {
    uVar9 = local_5a8;
  }
  if (uVar9 < (ulong)(local_590 + local_5b0)) {
    uVar9 = 0xf;
    if (local_598 != local_588) {
      uVar9 = local_588[0];
    }
    if (uVar9 < (ulong)(local_590 + local_5b0)) goto LAB_00142f3f;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_598,0,(char *)0x0,(ulong)local_5b8);
  }
  else {
LAB_00142f3f:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5b8,(ulong)local_598);
  }
  local_528.super_Physical._vptr_Physical =
       (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length;
  psVar8 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar8) {
    local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
    local_528.super_Physical.physicalDescription.field_2._M_allocated_capacity = puVar5[3];
  }
  else {
    local_528.super_Physical.physicalDescription._M_string_length = *psVar8;
    local_528.super_Physical._vptr_Physical = (_func_int **)*puVar5;
  }
  local_528.super_Physical.physicalDescription._M_dataplus._M_p = (pointer)puVar5[1];
  *puVar5 = psVar8;
  puVar5[1] = 0;
  *(undefined1 *)psVar8 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_528);
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar8) {
    local_428._16_8_ = *psVar8;
    aaStack_410[0]._0_8_ = plVar4[3];
    local_428._0_8_ = local_428 + 0x10;
  }
  else {
    local_428._16_8_ = *psVar8;
    local_428._0_8_ = (size_type *)*plVar4;
  }
  local_428._8_8_ = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Matrix::setName(__return_storage_ptr__,(string *)local_428);
  if ((undefined1 *)local_428._0_8_ != local_428 + 0x10) {
    operator_delete((void *)local_428._0_8_,local_428._16_8_ + 1);
  }
  if (local_528.super_Physical._vptr_Physical !=
      (_func_int **)&local_528.super_Physical.physicalDescription._M_string_length) {
    operator_delete(local_528.super_Physical._vptr_Physical,
                    local_528.super_Physical.physicalDescription._M_string_length + 1);
  }
  if (local_598 != local_588) {
    operator_delete(local_598,local_588[0] + 1);
  }
  if (local_5b8 != &local_5a8) {
    operator_delete(local_5b8,local_5a8 + 1);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,local_568 + 1);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],local_548[0] + 1);
  }
LAB_001430be:
  Matrix::operator=(__return_storage_ptr__,this->dSample);
  return __return_storage_ptr__;
}

Assistant:

Matrix ScalarEstimator::getEstimate(const Property& p)
{
	double samples = nSamples? double(nSamples): 1.0;
	
	if(p & nEstimate & EST_SAMPLE) {
		Matrix a;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("sample of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = dSample;
		return a;
	}
	else if(p & nEstimate & EST_MEAN) {
		Matrix a;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("mean of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = dOne / samples;
		return a;
	}
	else if(p & nEstimate & EST_VAR) {
		Matrix a;
		double mean = dOne / samples;
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("variance of " + pSource->getName() + " (" + pSource->getType() + ")" );
		}
		a = (dTwo/samples - mean*mean);
		return a;
	}
	else if(p & nEstimate & EST_DENS) {
		Matrix a(nDist, 2);
		a.setPhysical(0, *(new Physical()));
		if(pSource) {
			a.setPhysical(*pSource);
			a.setName("probability distribution"+ pSource->getName() + " (" + pSource->getType() + ")" );
		}
		for(int i=0; i<nDist; i++) {
			a[i][0] = (double(i) * dDistScale) + dDistOffset;
            a[i][1] = aDist[i] / samples / dDistScale;
		}
		return a;
	}
	cout << "didn't find property" << endl;
	cout << "stored: " << nEstimate << ", requested: " << p << endl;
	return Matrix();
}